

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

UniquePtr<X509> __thiscall
anon_unknown.dwarf_52317d::ReencodeCertificate(anon_unknown_dwarf_52317d *this,X509 *cert)

{
  X509 *__p;
  pointer local_40;
  uint8_t *inp;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_30;
  UniquePtr<uint8_t> free_der;
  pointer puStack_20;
  int len;
  uint8_t *der;
  X509 *cert_local;
  
  puStack_20 = (pointer)0x0;
  der = (uint8_t *)cert;
  cert_local = (X509 *)this;
  free_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ =
       i2d_X509(cert,&stack0xffffffffffffffe0);
  std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&local_30,puStack_20);
  if (free_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ < 1) {
    std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<x509_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  }
  else {
    local_40 = puStack_20;
    __p = d2i_X509((X509 **)0x0,&local_40,
                   (long)free_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>
                         ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_);
    std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<x509_st,bssl::internal::Deleter> *)this,(pointer)__p);
  }
  inp._4_4_ = 1;
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<X509> ReencodeCertificate(X509 *cert) {
  uint8_t *der = nullptr;
  int len = i2d_X509(cert, &der);
  bssl::UniquePtr<uint8_t> free_der(der);
  if (len <= 0) {
    return nullptr;
  }

  const uint8_t *inp = der;
  return bssl::UniquePtr<X509>(d2i_X509(nullptr, &inp, len));
}